

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O2

QBitArray * QBitArray::fromBits(QBitArray *__return_storage_ptr__,char *data,qsizetype size)

{
  char *pcVar1;
  
  (__return_storage_ptr__->d).d.d = (Data *)0x0;
  (__return_storage_ptr__->d).d.ptr = (char *)0x0;
  (__return_storage_ptr__->d).d.size = 0;
  if (0 < size) {
    QByteArray::resize(&__return_storage_ptr__->d,(size + 7U >> 3) + 1);
    pcVar1 = QByteArray::data(&__return_storage_ptr__->d);
    memcpy(pcVar1 + 1,data,(__return_storage_ptr__->d).d.size - 1);
    pcVar1 = QByteArray::data(&__return_storage_ptr__->d);
    adjust_head_and_tail(pcVar1,(__return_storage_ptr__->d).d.size,size);
  }
  return __return_storage_ptr__;
}

Assistant:

QBitArray QBitArray::fromBits(const char *data, qsizetype size)
{
    Q_ASSERT_X(size >= 0, "QBitArray::fromBits", "Size must be greater than or equal to 0.");
    QBitArray result;
    if (size <= 0)
        return result;

    auto &d = result.d;
    d.resize(allocation_size(size));
    memcpy(d.data() + 1, data, d.size() - 1);
    adjust_head_and_tail(d.data(), d.size(), size);
    return result;
}